

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MinefieldStatePdu.cpp
# Opt level: O2

void __thiscall DIS::MinefieldStatePdu::~MinefieldStatePdu(MinefieldStatePdu *this)

{
  (this->super_MinefieldFamilyPdu).super_Pdu._vptr_Pdu =
       (_func_int **)&PTR__MinefieldStatePdu_001b1918;
  std::vector<DIS::Point,_std::allocator<DIS::Point>_>::clear(&this->_perimeterPoints);
  std::vector<DIS::EntityType,_std::allocator<DIS::EntityType>_>::clear(&this->_mineType);
  std::vector<DIS::EntityType,_std::allocator<DIS::EntityType>_>::~vector(&this->_mineType);
  std::vector<DIS::Point,_std::allocator<DIS::Point>_>::~vector(&this->_perimeterPoints);
  Orientation::~Orientation(&this->_minefieldOrientation);
  Vector3Double::~Vector3Double(&this->_minefieldLocation);
  EntityType::~EntityType(&this->_minefieldType);
  EntityID::~EntityID(&this->_minefieldID);
  MinefieldFamilyPdu::~MinefieldFamilyPdu(&this->super_MinefieldFamilyPdu);
  return;
}

Assistant:

MinefieldStatePdu::~MinefieldStatePdu()
{
    _perimeterPoints.clear();
    _mineType.clear();
}